

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

VariableIndex __thiscall cnn::ComputationGraph::add_input(ComputationGraph *this,real s)

{
  pointer *pppNVar1;
  iterator __position;
  ComputationGraph *in_RSI;
  Node *local_20;
  
  __position._M_current =
       (in_RSI->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)((long)__position._M_current -
                    (long)(in_RSI->nodes).
                          super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  local_20 = (Node *)operator_new(0x60);
  (local_20->dim).nd = 0;
  (local_20->dim).bd = 1;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20->_vptr_Node = (_func_int **)&PTR__Node_003131b0;
  *(real *)&local_20[1]._vptr_Node = s;
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(local_20 + 1);
  if (__position._M_current ==
      (in_RSI->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)in_RSI,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppNVar1 = &(in_RSI->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  set_dim_for_new_node(in_RSI,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_input(real s) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new ScalarInputNode(s));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}